

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O1

void duplicate_general_repeat(Am_Object *command_obj,bool reload_data,Am_Value *new_sel)

{
  Am_Wrapper *pAVar1;
  Am_Value *pAVar2;
  Am_Object group;
  Am_Object selection_widget;
  Am_Value_List copy_copy_objs;
  Am_Value_List copy_objs;
  Am_Value_List orig_objs;
  Am_Value_List old_selection;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Value_List local_c0;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Value_List local_98;
  Am_Value_List local_88;
  Am_Value_List local_78;
  Am_Value_List local_68;
  Am_Value_List local_58;
  Am_Value_List local_48;
  Am_Value_List local_38;
  Am_Value local_28;
  
  local_c8.data = (Am_Object_Data *)0x0;
  local_d0.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&local_88);
  Am_Value_List::Am_Value_List(&local_98);
  Am_Value_List::Am_Value_List(&local_78);
  Am_Object::Am_Object(&local_a0,command_obj);
  Am_Get_Selection_Widget_For_Command((Am_Object *)&local_c0);
  Am_Object::operator=(&local_c8,(Am_Object *)&local_c0);
  Am_Object::~Am_Object((Am_Object *)&local_c0);
  Am_Object::~Am_Object(&local_a0);
  if (reload_data) {
    Am_Value_List::Am_Value_List(&local_c0);
    Am_Object::Am_Object(&local_a8,&local_c8);
    Am_Value::Am_Value(&local_28,new_sel);
    Am_Get_Sel_Or_Param_In_Display_Order(&local_a8,&local_88,&local_d0,&local_28);
    Am_Value::~Am_Value(&local_28);
    Am_Object::~Am_Object(&local_a8);
    Am_Object::Set(command_obj,0x16d,new_sel,0);
    Am_Value_List::Am_Value_List(&local_48,&local_88);
    Am_Copy_Object_List(&local_38,(Am_Object *)&local_48,0x2eff38);
    Am_Value_List::operator=(&local_c0,&local_38);
    Am_Value_List::~Am_Value_List(&local_38);
    Am_Value_List::~Am_Value_List(&local_48);
    pAVar1 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_c0);
    Am_Object::Set(command_obj,0x11a,pAVar1,0);
    Am_Value_List::~Am_Value_List(&local_c0);
  }
  else {
    pAVar2 = Am_Object::Get(command_obj,0x11a,0);
    Am_Value_List::operator=(&local_88,pAVar2);
    pAVar2 = Am_Object::Get(command_obj,0x171,0);
    Am_Object::operator=(&local_d0,pAVar2);
  }
  Am_Value_List::Am_Value_List(&local_58,&local_88);
  Am_Copy_Object_List(&local_c0,(Am_Object *)&local_58,(int)&local_d0);
  Am_Value_List::operator=(&local_98,&local_c0);
  Am_Value_List::~Am_Value_List(&local_c0);
  Am_Value_List::~Am_Value_List(&local_58);
  Am_Object::Set(command_obj,0x16f,false,0);
  Am_Object::Am_Object(&local_b0,&local_d0);
  Am_Value_List::Am_Value_List(&local_68,&local_98);
  Am_Put_Objects_Into_Group(&local_b0,&local_68);
  Am_Value_List::~Am_Value_List(&local_68);
  Am_Object::~Am_Object(&local_b0);
  pAVar1 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_98);
  Am_Object::Set(command_obj,0x169,pAVar1,0);
  pAVar2 = Am_Object::Get(&local_c8,0x169,0);
  Am_Value_List::operator=(&local_78,pAVar2);
  pAVar1 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_78);
  Am_Object::Set(command_obj,0x16c,pAVar1,0);
  pAVar1 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_98);
  Am_Object::Set(&local_c8,0x169,pAVar1,0);
  Am_Value_List::~Am_Value_List(&local_78);
  Am_Value_List::~Am_Value_List(&local_98);
  Am_Value_List::~Am_Value_List(&local_88);
  Am_Object::~Am_Object(&local_d0);
  Am_Object::~Am_Object(&local_c8);
  return;
}

Assistant:

void
duplicate_general_repeat(Am_Object command_obj, bool reload_data,
                         Am_Value new_sel)
{
  // repeat = duplicate a new copy of the objects
  Am_Object selection_widget, group;
  Am_Value_List orig_objs, copy_objs, old_selection;
  selection_widget = Am_Get_Selection_Widget_For_Command(command_obj);
  if (reload_data) {
    Am_Value_List copy_copy_objs;
    Am_Get_Sel_Or_Param_In_Display_Order(selection_widget, orig_objs, group,
                                         new_sel);
    command_obj.Set(Am_OBJECT_MODIFIED, new_sel);
    copy_copy_objs = Am_Copy_Object_List(orig_objs);
    command_obj.Set(Am_START_OBJECT, copy_copy_objs); //in case repeat
  } else {
    orig_objs = command_obj.Get(Am_START_OBJECT);
    group = command_obj.Get(Am_SAVED_OLD_OBJECT_OWNER);
  }
  copy_objs = Am_Copy_Object_List(orig_objs, group, DUPLICATE_OFFSET);
  command_obj.Set(Am_HAS_BEEN_UNDONE, false);
  Am_Put_Objects_Into_Group(group, copy_objs);
  command_obj.Set(Am_VALUE, copy_objs);
  old_selection = selection_widget.Get(Am_VALUE);
  command_obj.Set(Am_OLD_VALUE, old_selection);
  selection_widget.Set(Am_VALUE, copy_objs);
}